

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::RadialDistortion::invTransform
          (RadialDistortion *this,double *xd,double *yd,double xx,double yy)

{
  long ltmp [2];
  double fvec [2];
  double x [2];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double dtmp [16];
  
  local_c8 = this->kd[0];
  dStack_c0 = this->kd[1];
  local_b8 = this->kd[2];
  ltmp[0] = 0;
  ltmp[1] = 0;
  dtmp[0xe] = 0.0;
  dtmp[0xf] = 0.0;
  dtmp[0xc] = 0.0;
  dtmp[0xd] = 0.0;
  dtmp[10] = 0.0;
  dtmp[0xb] = 0.0;
  dtmp[8] = 0.0;
  dtmp[9] = 0.0;
  dtmp[6] = 0.0;
  dtmp[7] = 0.0;
  dtmp[4] = 0.0;
  dtmp[5] = 0.0;
  dtmp[2] = 0.0;
  dtmp[3] = 0.0;
  dtmp[0] = 0.0;
  dtmp[1] = 0.0;
  x[0] = xx;
  x[1] = yy;
  local_b0 = xx;
  local_a8 = yy;
  slmder(anon_unknown_0::computeRadialDistortion,2,2,x,fvec,&local_c8,1e-06,ltmp,dtmp);
  *xd = x[0];
  *yd = x[1];
  return;
}

Assistant:

void RadialDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  double x[2]= {xx, yy};

  RadialDistortionParameter param;

  param.kd[0]=kd[0];
  param.kd[1]=kd[1];
  param.kd[2]=kd[2];
  param.xd=xx;
  param.yd=yy;

  double fvec[2];

  long ltmp[2]= {0, 0};
  double dtmp[16];

  memset(dtmp, 0, 16*sizeof(double));
  gmath::slmder(computeRadialDistortion, 2, 2, x, fvec, &param, 1e-6, ltmp, dtmp);

  xd=x[0];
  yd=x[1];
}